

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void pbrt::detail::
     Dispatch<pbrt::Film::AddSplat(pbrt::Point2<float>,pbrt::SampledSpectrum,pbrt::SampledWavelengths_const&)::__0&,void,pbrt::RGBFilm,pbrt::GBufferFilm,pbrt::SpectralFilm>
               (anon_class_24_3_ed2e91d8 *func,void *ptr,int index)

{
  int in_EDX;
  GBufferFilm *in_RDI;
  undefined4 unaff_retaddr;
  
  if (in_EDX == 0) {
    Film::AddSplat(pbrt::Point2<float>,pbrt::SampledSpectrum,pbrt::SampledWavelengths_const&)::$_0::
    operator()((anon_class_24_3_ed2e91d8 *)CONCAT44(index,unaff_retaddr),(RGBFilm *)in_RDI);
  }
  else if (in_EDX == 1) {
    Film::AddSplat(pbrt::Point2<float>,pbrt::SampledSpectrum,pbrt::SampledWavelengths_const&)::$_0::
    operator()((anon_class_24_3_ed2e91d8 *)CONCAT44(index,unaff_retaddr),in_RDI);
  }
  else {
    Film::AddSplat(pbrt::Point2<float>,pbrt::SampledSpectrum,pbrt::SampledWavelengths_const&)::$_0::
    operator()((anon_class_24_3_ed2e91d8 *)CONCAT44(index,unaff_retaddr),(SpectralFilm *)in_RDI);
  }
  return;
}

Assistant:

PBRT_CPU_GPU R Dispatch(F &&func, void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 3);

    switch (index) {
    case 0:
        return func((T0 *)ptr);
    case 1:
        return func((T1 *)ptr);
    default:
        return func((T2 *)ptr);
    }
}